

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixLock(sqlite3_file *id,int eFileLock)

{
  byte bVar1;
  byte bVar2;
  sqlite3_io_methods *psVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  int sqliteIOErr;
  long in_FS_OFFSET;
  undefined1 local_58 [40];
  long local_30;
  
  iVar5 = (int)local_58;
  iVar7 = (int)local_58;
  sqliteIOErr = (int)local_58;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  iVar6 = 0;
  if (eFileLock <= (int)(uint)*(byte *)((long)&id[3].pMethods + 4)) goto LAB_00132127;
  psVar3 = id[2].pMethods;
  if ((sqlite3_mutex *)psVar3->xRead != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)((sqlite3_mutex *)psVar3->xRead);
  }
  bVar1 = *(byte *)((long)&id[3].pMethods + 4);
  bVar2 = *(byte *)&psVar3->xTruncate;
  if ((bVar1 == bVar2) || (iVar6 = 5, eFileLock < 2 && bVar2 < 3)) {
    if (eFileLock == 1) {
      if (1 < (byte)(bVar2 - 1)) {
        local_58._0_8_ = (ulong)(uint)local_58._4_4_ << 0x20;
        goto LAB_00131f73;
      }
      *(undefined1 *)((long)&id[3].pMethods + 4) = 1;
      psVar3->xWrite =
           (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)
           CONCAT44((int)((ulong)psVar3->xWrite >> 0x20) + 1,(int)psVar3->xWrite + 1);
    }
    else {
      local_58._16_8_ = (undefined1 *)0x1;
      local_58._2_2_ = 0;
      if (bVar1 == 2 && eFileLock == 4) {
LAB_00131f73:
        uVar4 = local_58._0_8_;
        local_58._16_8_ = (undefined1 *)0x1;
        local_58[1] = 0;
        local_58[0] = eFileLock != 1;
        local_58._2_6_ = SUB86(uVar4,2);
        local_58._8_8_ = SEXT48(sqlite3PendingByte);
        iVar6 = unixFileLock((unixFile *)id,(flock *)local_58);
        if (iVar6 != 0) {
          piVar8 = __errno_location();
          iVar7 = *piVar8;
          iVar5 = sqliteErrorFromPosixError(iVar7,iVar5);
          iVar6 = 5;
          if (iVar5 != 5) {
            *(int *)&id[4].pMethods = iVar7;
            iVar6 = iVar5;
          }
          goto LAB_00132117;
        }
        if (eFileLock == 4) {
          *(undefined1 *)((long)&id[3].pMethods + 4) = 3;
          *(undefined1 *)&psVar3->xTruncate = 3;
        }
      }
      if (eFileLock == 1) {
        local_58._8_8_ = (long)sqlite3PendingByte + 2;
        local_58._16_8_ = 0x1fe;
        iVar6 = unixFileLock((unixFile *)id,(flock *)local_58);
        if (iVar6 == 0) {
          iVar6 = 0;
          iVar5 = 0;
        }
        else {
          piVar8 = __errno_location();
          iVar5 = *piVar8;
          iVar6 = sqliteErrorFromPosixError(iVar5,sqliteIOErr);
        }
        local_58._8_8_ = SEXT48(sqlite3PendingByte);
        local_58._16_8_ = (undefined1 *)0x1;
        local_58._0_2_ = 2;
        iVar7 = unixFileLock((unixFile *)id,(flock *)local_58);
        if (iVar6 == 0 && iVar7 != 0) {
          piVar8 = __errno_location();
          iVar5 = *piVar8;
          iVar6 = 0x80a;
        }
        if (iVar6 != 0) {
          if (iVar6 != 5) {
            *(int *)&id[4].pMethods = iVar5;
          }
          goto LAB_00132117;
        }
        *(undefined1 *)((long)&id[3].pMethods + 4) = 1;
        piVar8 = (int *)((long)&psVar3->xWrite + 4);
        *piVar8 = *piVar8 + 1;
        *(undefined4 *)&psVar3->xWrite = 1;
LAB_00132103:
        iVar6 = 0;
      }
      else if ((eFileLock != 4) || (iVar6 = 5, *(int *)&psVar3->xWrite < 2)) {
        local_58._0_2_ = 1;
        local_58._8_8_ = (ulong)(eFileLock != 2) + 1 + (long)sqlite3PendingByte;
        local_58._16_8_ = (undefined1 *)0x1fe;
        if (eFileLock == 2) {
          local_58._16_8_ = (undefined1 *)0x1;
        }
        iVar6 = unixFileLock((unixFile *)id,(flock *)local_58);
        if (iVar6 == 0) goto LAB_00132103;
        piVar8 = __errno_location();
        iVar5 = *piVar8;
        iVar7 = sqliteErrorFromPosixError(iVar5,iVar7);
        iVar6 = 5;
        if (iVar7 != 5) {
          *(int *)&id[4].pMethods = iVar5;
          iVar6 = iVar7;
        }
      }
      if (iVar6 != 0) goto LAB_00132117;
      *(char *)((long)&id[3].pMethods + 4) = (char)eFileLock;
      *(char *)&psVar3->xTruncate = (char)eFileLock;
    }
    iVar6 = 0;
  }
LAB_00132117:
  if ((sqlite3_mutex *)psVar3->xRead != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)((sqlite3_mutex *)psVar3->xRead);
  }
LAB_00132127:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

static int unixLock(sqlite3_file *id, int eFileLock){
  /* The following describes the implementation of the various locks and
  ** lock transitions in terms of the POSIX advisory shared and exclusive
  ** lock primitives (called read-locks and write-locks below, to avoid
  ** confusion with SQLite lock names). The algorithms are complicated
  ** slightly in order to be compatible with Windows95 systems simultaneously
  ** accessing the same database file, in case that is ever required.
  **
  ** Symbols defined in os.h identify the 'pending byte' and the 'reserved
  ** byte', each single bytes at well known offsets, and the 'shared byte
  ** range', a range of 510 bytes at a well known offset.
  **
  ** To obtain a SHARED lock, a read-lock is obtained on the 'pending
  ** byte'.  If this is successful, 'shared byte range' is read-locked
  ** and the lock on the 'pending byte' released.  (Legacy note:  When
  ** SQLite was first developed, Windows95 systems were still very common,
  ** and Windows95 lacks a shared-lock capability.  So on Windows95, a
  ** single randomly selected by from the 'shared byte range' is locked.
  ** Windows95 is now pretty much extinct, but this work-around for the
  ** lack of shared-locks on Windows95 lives on, for backwards
  ** compatibility.)
  **
  ** A process may only obtain a RESERVED lock after it has a SHARED lock.
  ** A RESERVED lock is implemented by grabbing a write-lock on the
  ** 'reserved byte'.
  **
  ** An EXCLUSIVE lock may only be requested after either a SHARED or
  ** RESERVED lock is held. An EXCLUSIVE lock is implemented by obtaining
  ** a write-lock on the entire 'shared byte range'. Since all other locks
  ** require a read-lock on one of the bytes within this range, this ensures
  ** that no other locks are held on the database.
  **
  ** If a process that holds a RESERVED lock requests an EXCLUSIVE, then
  ** a PENDING lock is obtained first. A PENDING lock is implemented by
  ** obtaining a write-lock on the 'pending byte'. This ensures that no new
  ** SHARED locks can be obtained, but existing SHARED locks are allowed to
  ** persist. If the call to this function fails to obtain the EXCLUSIVE
  ** lock in this case, it holds the PENDING lock instead. The client may
  ** then re-attempt the EXCLUSIVE lock later on, after existing SHARED
  ** locks have cleared.
  */
  int rc = SQLITE_OK;
  unixFile *pFile = (unixFile*)id;
  unixInodeInfo *pInode;
  struct flock lock;
  int tErrno = 0;

  assert( pFile );
  OSTRACE(("LOCK    %d %s was %s(%s,%d) pid=%d (unix)\n", pFile->h,
      azFileLock(eFileLock), azFileLock(pFile->eFileLock),
      azFileLock(pFile->pInode->eFileLock), pFile->pInode->nShared,
      osGetpid(0)));

  /* If there is already a lock of this type or more restrictive on the
  ** unixFile, do nothing. Don't use the end_lock: exit path, as
  ** unixEnterMutex() hasn't been called yet.
  */
  if( pFile->eFileLock>=eFileLock ){
    OSTRACE(("LOCK    %d %s ok (already held) (unix)\n", pFile->h,
            azFileLock(eFileLock)));
    return SQLITE_OK;
  }

  /* Make sure the locking sequence is correct.
  **  (1) We never move from unlocked to anything higher than shared lock.
  **  (2) SQLite never explicitly requests a pending lock.
  **  (3) A shared lock is always held when a reserve lock is requested.
  */
  assert( pFile->eFileLock!=NO_LOCK || eFileLock==SHARED_LOCK );
  assert( eFileLock!=PENDING_LOCK );
  assert( eFileLock!=RESERVED_LOCK || pFile->eFileLock==SHARED_LOCK );

  /* This mutex is needed because pFile->pInode is shared across threads
  */
  pInode = pFile->pInode;
  sqlite3_mutex_enter(pInode->pLockMutex);

  /* If some thread using this PID has a lock via a different unixFile*
  ** handle that precludes the requested lock, return BUSY.
  */
  if( (pFile->eFileLock!=pInode->eFileLock &&
          (pInode->eFileLock>=PENDING_LOCK || eFileLock>SHARED_LOCK))
  ){
    rc = SQLITE_BUSY;
    goto end_lock;
  }

  /* If a SHARED lock is requested, and some thread using this PID already
  ** has a SHARED or RESERVED lock, then increment reference counts and
  ** return SQLITE_OK.
  */
  if( eFileLock==SHARED_LOCK &&
      (pInode->eFileLock==SHARED_LOCK || pInode->eFileLock==RESERVED_LOCK) ){
    assert( eFileLock==SHARED_LOCK );
    assert( pFile->eFileLock==0 );
    assert( pInode->nShared>0 );
    pFile->eFileLock = SHARED_LOCK;
    pInode->nShared++;
    pInode->nLock++;
    goto end_lock;
  }


  /* A PENDING lock is needed before acquiring a SHARED lock and before
  ** acquiring an EXCLUSIVE lock.  For the SHARED lock, the PENDING will
  ** be released.
  */
  lock.l_len = 1L;
  lock.l_whence = SEEK_SET;
  if( eFileLock==SHARED_LOCK
   || (eFileLock==EXCLUSIVE_LOCK && pFile->eFileLock==RESERVED_LOCK)
  ){
    lock.l_type = (eFileLock==SHARED_LOCK?F_RDLCK:F_WRLCK);
    lock.l_start = PENDING_BYTE;
    if( unixFileLock(pFile, &lock) ){
      tErrno = errno;
      rc = sqliteErrorFromPosixError(tErrno, SQLITE_IOERR_LOCK);
      if( rc!=SQLITE_BUSY ){
        storeLastErrno(pFile, tErrno);
      }
      goto end_lock;
    }else if( eFileLock==EXCLUSIVE_LOCK ){
      pFile->eFileLock = PENDING_LOCK;
      pInode->eFileLock = PENDING_LOCK;
    }
  }


  /* If control gets to this point, then actually go ahead and make
  ** operating system calls for the specified lock.
  */
  if( eFileLock==SHARED_LOCK ){
    assert( pInode->nShared==0 );
    assert( pInode->eFileLock==0 );
    assert( rc==SQLITE_OK );

    /* Now get the read-lock */
    lock.l_start = SHARED_FIRST;
    lock.l_len = SHARED_SIZE;
    if( unixFileLock(pFile, &lock) ){
      tErrno = errno;
      rc = sqliteErrorFromPosixError(tErrno, SQLITE_IOERR_LOCK);
    }

    /* Drop the temporary PENDING lock */
    lock.l_start = PENDING_BYTE;
    lock.l_len = 1L;
    lock.l_type = F_UNLCK;
    if( unixFileLock(pFile, &lock) && rc==SQLITE_OK ){
      /* This could happen with a network mount */
      tErrno = errno;
      rc = SQLITE_IOERR_UNLOCK;
    }

    if( rc ){
      if( rc!=SQLITE_BUSY ){
        storeLastErrno(pFile, tErrno);
      }
      goto end_lock;
    }else{
      pFile->eFileLock = SHARED_LOCK;
      pInode->nLock++;
      pInode->nShared = 1;
    }
  }else if( eFileLock==EXCLUSIVE_LOCK && pInode->nShared>1 ){
    /* We are trying for an exclusive lock but another thread in this
    ** same process is still holding a shared lock. */
    rc = SQLITE_BUSY;
  }else{
    /* The request was for a RESERVED or EXCLUSIVE lock.  It is
    ** assumed that there is a SHARED or greater lock on the file
    ** already.
    */
    assert( 0!=pFile->eFileLock );
    lock.l_type = F_WRLCK;

    assert( eFileLock==RESERVED_LOCK || eFileLock==EXCLUSIVE_LOCK );
    if( eFileLock==RESERVED_LOCK ){
      lock.l_start = RESERVED_BYTE;
      lock.l_len = 1L;
    }else{
      lock.l_start = SHARED_FIRST;
      lock.l_len = SHARED_SIZE;
    }

    if( unixFileLock(pFile, &lock) ){
      tErrno = errno;
      rc = sqliteErrorFromPosixError(tErrno, SQLITE_IOERR_LOCK);
      if( rc!=SQLITE_BUSY ){
        storeLastErrno(pFile, tErrno);
      }
    }
  }


#ifdef SQLITE_DEBUG
  /* Set up the transaction-counter change checking flags when
  ** transitioning from a SHARED to a RESERVED lock.  The change
  ** from SHARED to RESERVED marks the beginning of a normal
  ** write operation (not a hot journal rollback).
  */
  if( rc==SQLITE_OK
   && pFile->eFileLock<=SHARED_LOCK
   && eFileLock==RESERVED_LOCK
  ){
    pFile->transCntrChng = 0;
    pFile->dbUpdate = 0;
    pFile->inNormalWrite = 1;
  }
#endif

  if( rc==SQLITE_OK ){
    pFile->eFileLock = eFileLock;
    pInode->eFileLock = eFileLock;
  }

end_lock:
  sqlite3_mutex_leave(pInode->pLockMutex);
  OSTRACE(("LOCK    %d %s %s (unix)\n", pFile->h, azFileLock(eFileLock),
      rc==SQLITE_OK ? "ok" : "failed"));
  return rc;
}